

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int parse_line(archive_read *a,archive_entry *entry,mtree *mtree,mtree_entry *mp,int *parsed_kws)

{
  int iVar1;
  long in_RCX;
  archive *in_RDI;
  uint *in_R8;
  int r1;
  int r;
  mtree_option *iter;
  int *in_stack_00000058;
  mtree_option *in_stack_00000060;
  archive_entry *in_stack_00000068;
  mtree *in_stack_00000070;
  archive_read *in_stack_00000078;
  int local_3c;
  undefined8 *local_38;
  int local_4;
  
  local_3c = 0;
  for (local_38 = *(undefined8 **)(in_RCX + 8); local_38 != (undefined8 *)0x0;
      local_38 = (undefined8 *)*local_38) {
    iVar1 = parse_keyword(in_stack_00000078,in_stack_00000070,in_stack_00000068,in_stack_00000060,
                          in_stack_00000058);
    if (iVar1 < local_3c) {
      local_3c = iVar1;
    }
  }
  if ((local_3c == 0) && ((*in_R8 & 0x100) == 0)) {
    archive_set_error(in_RDI,0x54,"Missing type keyword in mtree specification");
    local_4 = -0x14;
  }
  else {
    local_4 = local_3c;
  }
  return local_4;
}

Assistant:

static int
parse_line(struct archive_read *a, struct archive_entry *entry,
    struct mtree *mtree, struct mtree_entry *mp, int *parsed_kws)
{
	struct mtree_option *iter;
	int r = ARCHIVE_OK, r1;

	for (iter = mp->options; iter != NULL; iter = iter->next) {
		r1 = parse_keyword(a, mtree, entry, iter, parsed_kws);
		if (r1 < r)
			r = r1;
	}
	if (r == ARCHIVE_OK && (*parsed_kws & MTREE_HAS_TYPE) == 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Missing type keyword in mtree specification");
		return (ARCHIVE_WARN);
	}
	return (r);
}